

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int string_buffer_init2(JSContext *ctx,StringBuffer *s,int size,int is_wide)

{
  JSString *pJVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  *in_RSI = in_RDI;
  *(undefined4 *)((long)in_RSI + 0x14) = in_EDX;
  *(undefined4 *)(in_RSI + 2) = 0;
  *(undefined4 *)(in_RSI + 3) = in_ECX;
  *(undefined4 *)((long)in_RSI + 0x1c) = 0;
  pJVar1 = js_alloc_string((JSContext *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  in_RSI[1] = pJVar1;
  if (in_RSI[1] == 0) {
    *(undefined4 *)((long)in_RSI + 0x14) = 0;
    *(undefined4 *)((long)in_RSI + 0x1c) = 0xffffffff;
    iVar2 = -1;
  }
  else {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int string_buffer_init2(JSContext *ctx, StringBuffer *s, int size,
                               int is_wide)
{
    s->ctx = ctx;
    s->size = size;
    s->len = 0;
    s->is_wide_char = is_wide;
    s->error_status = 0;
    s->str = js_alloc_string(ctx, size, is_wide);
    if (unlikely(!s->str)) {
        s->size = 0;
        return s->error_status = -1;
    }
#ifdef DUMP_LEAKS
    /* the StringBuffer may reallocate the JSString, only link it at the end */
    list_del(&s->str->link);
#endif
    return 0;
}